

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_util.cpp
# Opt level: O3

int duckdb_brotli::BrotliIsMostlyUTF8
              (uint8_t *data,size_t pos,size_t mask,size_t length,double min_fraction)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if (length == 0) {
    dVar10 = 0.0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar2 = uVar6 + pos & mask;
      bVar1 = data[uVar2];
      uVar3 = (uint)bVar1;
      lVar7 = 1;
      if ((char)bVar1 < '\x01') {
        uVar8 = length - uVar6;
        if (1 < uVar8) {
          uVar4 = (uint)bVar1;
          if ((((uVar3 & 0xffffffe0) == 0xc0) && ((data[uVar2 + 1] & 0xffffffc0) == 0x80)) &&
             (uVar9 = (uVar4 & 0x1f) << 6, 0x7f < uVar9)) {
            uVar3 = data[uVar2 + 1] & 0x3f | uVar9;
            lVar7 = 2;
            goto LAB_01bfa6c6;
          }
          if (uVar8 != 2) {
            if ((((uVar4 & 0xfffffff0) == 0xe0) && ((data[uVar2 + 1] & 0xffffffc0) == 0x80)) &&
               (((data[uVar2 + 2] & 0xc0) == 0x80 &&
                (uVar4 = (data[uVar2 + 1] & 0x3f) << 6 | (uVar4 & 0xf) << 0xc, 0x7ff < uVar4)))) {
              uVar3 = data[uVar2 + 2] & 0x3f | uVar4;
              lVar7 = 3;
              goto LAB_01bfa6c6;
            }
            if (((3 < uVar8) && ((uVar3 & 0xfffffff8) == 0xf0)) &&
               (((data[uVar2 + 1] & 0xc0) == 0x80 &&
                (((data[uVar2 + 2] & 0xffffffc0) == 0x80 && ((data[uVar2 + 3] & 0xffffffc0) == 0x80)
                 ))))) {
              uVar9 = (uVar3 & 7) * 0x40000;
              uVar4 = (data[uVar2 + 1] & 0x3f) * 0x1000;
              if ((uVar4 + uVar9) - 0x10000 < 0x100000) {
                uVar3 = data[uVar2 + 3] & 0x3f | (data[uVar2 + 2] & 0x3f) << 6 | uVar4 | uVar9;
                lVar7 = 4;
                goto LAB_01bfa6c6;
              }
            }
          }
        }
        uVar3 = uVar3 | 0x110000;
      }
LAB_01bfa6c6:
      uVar6 = uVar6 + lVar7;
      if (0x10ffff < uVar3) {
        lVar7 = 0;
      }
      lVar5 = lVar5 + lVar7;
    } while (uVar6 < length);
    auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = 0x45300000;
    dVar10 = (auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
  }
  auVar12._8_4_ = (int)(length >> 0x20);
  auVar12._0_8_ = length;
  auVar12._12_4_ = 0x45300000;
  return (int)(((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)length) - 4503599627370496.0)) * min_fraction <
              dVar10);
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliIsMostlyUTF8(
    const uint8_t* data, const size_t pos, const size_t mask,
    const size_t length, const double min_fraction) {
  size_t size_utf8 = 0;
  size_t i = 0;
  while (i < length) {
    int symbol;
    size_t bytes_read =
        BrotliParseAsUTF8(&symbol, &data[(pos + i) & mask], length - i);
    i += bytes_read;
    if (symbol < 0x110000) size_utf8 += bytes_read;
  }
  return TO_BROTLI_BOOL((double)size_utf8 > min_fraction * (double)length);
}